

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O2

void Sim_UtilAssignRandom(Sim_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->pNtk->vCis->nSize; i_00 = i_00 + 1) {
    pAVar5 = Abc_NtkCi(p->pNtk,i_00);
    pvVar1 = p->vSim0->pArray[pAVar5->Id];
    for (lVar6 = 0; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
      iVar2 = rand();
      iVar3 = rand();
      uVar4 = rand();
      *(uint *)((long)pvVar1 + lVar6 * 4) = uVar4 ^ iVar3 << 0xc ^ iVar2 << 0x18;
    }
  }
  return;
}

Assistant:

void Sim_UtilAssignRandom( Sim_Man_t * p )
{
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int i, k;
    // assign the random/systematic simulation info to the PIs
    Abc_NtkForEachCi( p->pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
        for ( k = 0; k < p->nSimWords; k++ )
            pSimInfo[k] = SIM_RANDOM_UNSIGNED;
    }
}